

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<96U,_unsigned_short,_void,_false>::eval_divide_knuth
          (uintwide_t<96U,_unsigned_short,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  bool bVar1;
  enable_if_t<(_false),_uintwide_t<96U,_unsigned_short>_> eVar2;
  reference pvVar3;
  undefined5 extraout_var;
  iterator first;
  iterator last;
  undefined4 extraout_EDX;
  bool bVar4;
  undefined8 local_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_8c;
  undefined4 local_84;
  undefined1 local_7f;
  undefined1 local_7e;
  int_fast8_t local_7d;
  bool left_is_equal_to_right;
  bool left_is_less_than_right;
  undefined8 uStack_7c;
  int_fast8_t result_of_compare_left_with_right;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 local_5c;
  reverse_iterator<const_unsigned_short_*> local_50;
  reverse_iterator<const_unsigned_short_*> local_48;
  reverse_iterator<const_unsigned_short_*> local_40;
  const_reverse_iterator crit_v;
  const_reverse_iterator crit_u;
  local_uint_index_type v_offset;
  local_uint_index_type u_offset;
  uintwide_t<24U,_unsigned_char,_void,_false> *remainder_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  v_offset = 0;
  crit_u.current = (unsigned_short *)0x0;
  crit_v = detail::array_detail::array<unsigned_short,_6UL>::crbegin
                     ((array<unsigned_short,_6UL> *)this);
  local_40.current =
       (unsigned_short *)
       detail::array_detail::array<unsigned_short,_6UL>::crbegin
                 ((array<unsigned_short,_6UL> *)other);
  while( true ) {
    local_48.current =
         (unsigned_short *)
         detail::array_detail::array<unsigned_short,_6UL>::crend((array<unsigned_short,_6UL> *)this)
    ;
    bVar1 = detail::iterator_detail::operator!=(&crit_v,&local_48);
    bVar4 = false;
    if (bVar1) {
      pvVar3 = detail::iterator_detail::reverse_iterator<const_unsigned_short_*>::operator*(&crit_v)
      ;
      bVar4 = *pvVar3 == 0;
    }
    if (!bVar4) break;
    detail::iterator_detail::reverse_iterator<const_unsigned_short_*>::operator++(&crit_v);
    v_offset = v_offset + 1;
  }
  while( true ) {
    local_50.current =
         (unsigned_short *)
         detail::array_detail::array<unsigned_short,_6UL>::crend
                   ((array<unsigned_short,_6UL> *)other);
    bVar1 = detail::iterator_detail::operator!=(&local_40,&local_50);
    bVar4 = false;
    if (bVar1) {
      pvVar3 = detail::iterator_detail::reverse_iterator<const_unsigned_short_*>::operator*
                         (&local_40);
      bVar4 = *pvVar3 == 0;
    }
    if (!bVar4) break;
    detail::iterator_detail::reverse_iterator<const_unsigned_short_*>::operator++(&local_40);
    crit_u.current = crit_u.current + 1;
  }
  if (crit_u.current == (unsigned_short *)0x6) {
    eVar2 = limits_helper_max<false>();
    local_70 = CONCAT53(extraout_var,eVar2.values.super_array<unsigned_char,_3UL>.elems);
    *(undefined8 *)this = local_70;
    *(undefined4 *)(this + 8) = extraout_EDX;
    if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
      local_5c = local_70;
      first = detail::array_detail::array<unsigned_short,_6UL>::begin
                        ((array<unsigned_short,_6UL> *)remainder);
      last = detail::array_detail::array<unsigned_short,_6UL>::end
                       ((array<unsigned_short,_6UL> *)remainder);
      detail::fill_unsafe<unsigned_short*,unsigned_short>(first,last,0);
    }
  }
  else if (v_offset == 6) {
    if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
      uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
      digits),void>::type__
                (&stack0xffffffffffffff84,'\0',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      *(undefined8 *)remainder = uStack_7c;
      *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) = local_74;
    }
  }
  else {
    local_7d = compare<false,_nullptr>(this,other);
    local_7e = local_7d == -1;
    local_7f = local_7d == '\0';
    if ((bool)local_7e) {
      if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
        *(undefined8 *)remainder = *(undefined8 *)this;
        *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) =
             *(undefined4 *)(this + 8);
      }
      uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
      digits),void>::type__
                (&local_8c,'\0',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      *(undefined8 *)this = local_8c;
      *(undefined4 *)(this + 8) = local_84;
    }
    else if ((bool)local_7f) {
      uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
      digits),void>::type__
                (&local_98,'\x01',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      *(undefined8 *)this = local_98;
      *(undefined4 *)(this + 8) = local_90;
      if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
        uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
        digits),void>::type__
                  (&local_a4,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        *(undefined8 *)remainder = local_a4;
        *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) = local_9c;
      }
    }
    else {
      void_math::wide_integer::uintwide_t<96u,unsigned_short,void,false>::
      eval_divide_knuth_core<96u>(unsigned_long,unsigned_long,math::wide_integer::
      uintwide_t<96u,unsigned_short,void,false>const&,math::wide_integer::
      uintwide_t<96u,unsigned_short,void,false>*,std::
      enable_if<((96u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_short>::
      digits))),int>::type__
                (this,v_offset,(unsigned_fast_type)crit_u.current,other,remainder,
                 (enable_if_t<(96U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                  *)0x0);
    }
  }
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }